

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::HDWallet::GeneratePrivkeyData
          (KeyData *__return_storage_ptr__,HDWallet *this,NetType network_type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_158;
  ByteData fingerprint;
  Privkey local_128;
  ExtPrivkey key;
  ExtPrivkey privkey;
  
  ExtPrivkey::ExtPrivkey(&privkey,&this->seed_,network_type);
  ExtPrivkey::DerivePrivkey(&key,&privkey,path);
  Privkey::Privkey(&local_128,&privkey.privkey_);
  Privkey::GeneratePubkey((Pubkey *)&_Stack_158,&local_128,true);
  Pubkey::GetFingerprint(&fingerprint,(Pubkey *)&_Stack_158,4);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_158);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  KeyData::KeyData(__return_storage_ptr__,&key,path,&fingerprint);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
  ExtPrivkey::~ExtPrivkey(&key);
  ExtPrivkey::~ExtPrivkey(&privkey);
  return __return_storage_ptr__;
}

Assistant:

KeyData HDWallet::GeneratePrivkeyData(
    NetType network_type, const std::vector<uint32_t>& path) const {
  ExtPrivkey privkey(seed_, network_type);
  ExtPrivkey key = privkey.DerivePrivkey(path);
  auto fingerprint = privkey.GetPrivkey().GeneratePubkey().GetFingerprint();
  return KeyData(key, path, fingerprint);
}